

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_medium.c
# Opt level: O1

block_state deflate_medium(deflate_state *s,int flush)

{
  byte bVar1;
  int iVar2;
  short sVar3;
  ushort uVar4;
  Pos PVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint32_t uVar18;
  ulong uVar19;
  uchar *puVar20;
  uchar *puVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  block_state bVar29;
  ulong uVar30;
  bool bVar31;
  uint local_50;
  
  iVar2 = s->level;
  uVar23 = 0;
  uVar27 = 0;
  uVar16 = 0;
  local_50 = 0;
  do {
    uVar30 = uVar16;
    if (s->lookahead < 0x106) {
      zng_fill_window(s);
      if (flush == 0 && s->lookahead < 0x106) {
        iVar24 = 1;
      }
      else {
        if (s->lookahead != 0) {
          uVar30 = 0;
          goto LAB_001111c9;
        }
        iVar24 = 2;
      }
    }
    else {
LAB_001111c9:
      if ((iVar2 < 5) ||
         (uVar9 = (uint)uVar23, uVar26 = uVar27, uVar25 = local_50, (short)uVar30 == 0)) {
        if (s->lookahead < 4) {
          uVar4 = 0;
        }
        else {
          uVar4 = quick_insert_string(s,s->strstart);
        }
        uVar9 = s->strstart;
        uVar26 = (ulong)uVar9;
        uVar25 = 0;
        uVar30 = 1;
        if (((uVar4 != 0) && (0 < (long)(uVar26 - uVar4))) &&
           ((long)(uVar26 - uVar4) <= (long)(ulong)(s->w_size - 0x106))) {
          uVar7 = (*functable.longest_match)(s,uVar4);
          if ((uVar7 & 0xfffc) == 0) {
            uVar7 = 1;
          }
          uVar4 = (ushort)s->match_start;
          uVar25 = (uint)uVar4;
          if (uVar4 < (ushort)uVar9) {
            uVar30 = (ulong)uVar7;
          }
        }
      }
      uVar13 = (uint)uVar30;
      uVar28 = uVar30 & 0xffff;
      uVar7 = (uint)uVar28;
      if (uVar7 + 4 < s->lookahead) {
        uVar14 = uVar9 & 0xffff;
        uVar11 = (uint)uVar26 + 1;
        uVar8 = uVar7 - 1 & 0xffff;
        uVar17 = uVar11 & 0xffff;
        if (uVar8 < 3) {
          if ((uVar8 == 0) || ((ushort)uVar11 < (ushort)uVar9)) goto LAB_00111296;
          uVar12 = uVar8 + (uVar11 & 0xffff);
LAB_001114fd:
          if (uVar12 <= uVar14) {
            uVar8 = (uVar14 - (uVar11 & 0xffff)) + 1;
          }
        }
        else {
          uVar12 = uVar8 + (uVar11 & 0xffff);
          if ((ushort)uVar9 <= (ushort)uVar11) goto LAB_001114fd;
          uVar8 = uVar12 - uVar14;
          uVar17 = uVar14;
          if (uVar12 < uVar14 || uVar8 == 0) goto LAB_00111296;
        }
        insert_string(s,uVar17,uVar8);
      }
LAB_00111296:
      uVar9 = (uint)uVar26 & 0xffff;
      if (((iVar2 < 5) || (s->lookahead < 0x107)) ||
         (uVar18 = uVar9 + uVar7, s->window_size - 0x106 <= uVar18)) {
        uVar16 = 0;
      }
      else {
        s->strstart = uVar18;
        PVar5 = quick_insert_string(s,uVar18);
        uVar17 = s->strstart;
        uVar23 = (ulong)uVar17;
        local_50 = 0;
        uVar16 = 1;
        if (((PVar5 == 0) || ((long)(uVar23 - PVar5) < 1)) ||
           ((long)(ulong)(s->w_size - 0x106) < (long)(uVar23 - PVar5))) {
          uVar27 = (ulong)uVar17;
          uVar8 = local_50;
        }
        else {
          uVar18 = (*functable.longest_match)(s,PVar5);
          uVar10 = (ulong)uVar18;
          uVar8 = s->match_start;
          uVar4 = (ushort)uVar8;
          uVar19 = (ulong)uVar4;
          uVar11 = uVar17 & 0xffff;
          if (uVar11 <= (uVar8 & 0xffff)) {
            uVar10 = 1;
          }
          uVar6 = (ushort)uVar10;
          uVar27 = uVar23;
          if (((3 < uVar6) && (uVar16 = uVar10, 1 < (ushort)uVar30)) &&
             ((uVar7 <= (uVar8 & 0xffff) + 1 && (uVar7 <= uVar11 + 1)))) {
            puVar20 = s->window;
            uVar22 = uVar23 & 0xffff;
            if (puVar20[(uVar19 + 1) - uVar28] == puVar20[(uVar22 + 1) - uVar28]) {
              uVar14 = s->w_size - 0x106;
              uVar7 = uVar17 - uVar14 & 0xffff;
              if (uVar11 <= uVar14) {
                uVar7 = 0;
              }
              bVar31 = uVar7 < uVar11;
              uVar28 = uVar23;
              uVar14 = uVar13;
              local_50 = uVar8;
              if ((1 < uVar4 && uVar6 < 0x100) &&
                  (bVar31 && puVar20[uVar19 - 1] == puVar20[uVar22 - 1])) {
                puVar21 = puVar20 + -2;
                uVar28 = uVar10;
                iVar24 = 0;
                do {
                  uVar11 = uVar11 - 1;
                  uVar14 = (int)uVar28 + 1;
                  uVar10 = (ulong)uVar14;
                  iVar15 = iVar24 + -1;
                  if (((puVar21[uVar19] != puVar21[uVar22]) ||
                      (sVar3 = (short)iVar24, (ushort)(sVar3 + (ushort)uVar30) == 1)) ||
                     ((uVar11 <= uVar7 || (0xfe < (ushort)uVar28)))) break;
                  puVar21 = puVar21 + -1;
                  uVar28 = (ulong)uVar14;
                  iVar24 = iVar15;
                } while (1 < (ushort)((sVar3 + uVar4) - 1));
                uVar28 = (ulong)(uVar17 + iVar15);
                local_50 = uVar8 + iVar15;
                uVar14 = iVar15 + uVar13;
              }
              if ((((1 < uVar4 && uVar6 < 0x100) &&
                    (bVar31 && puVar20[uVar19 - 1] == puVar20[uVar22 - 1])) && ((ushort)uVar14 < 2))
                 && ((short)uVar10 != 2)) {
                uVar23 = (ulong)(uVar17 + 1);
                uVar16 = uVar10;
                uVar27 = uVar28;
                uVar13 = uVar14;
                uVar8 = local_50;
              }
            }
          }
        }
        local_50 = uVar8;
        s->strstart = uVar9;
        uVar30 = (ulong)uVar13;
      }
      uVar4 = (ushort)uVar30;
      uVar7 = (uint)uVar30 & 0xffff;
      if (uVar4 < 4) {
        uVar9 = 0;
        while (uVar4 != 0) {
          bVar1 = s->window[uVar26 & 0xffff];
          uVar25 = s->sym_next;
          s->d_buf[uVar25] = 0;
          s->sym_next = uVar25 + 1;
          s->l_buf[uVar25] = bVar1;
          s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
          s->lookahead = s->lookahead - 1;
          uVar9 = uVar9 + (s->sym_next == s->sym_end);
          uVar26 = (ulong)((int)uVar26 + 1);
          uVar4 = (short)uVar30 - 1;
          uVar30 = (ulong)uVar4;
        }
      }
      else {
        iVar24 = uVar9 - (uVar25 & 0xffff);
        uVar9 = s->sym_next;
        s->d_buf[uVar9] = (uint16_t)iVar24;
        s->sym_next = uVar9 + 1;
        s->l_buf[uVar9] = (uchar)(uVar7 - 3);
        s->matches = s->matches + 1;
        s->dyn_ltree[(ulong)""[uVar7 - 3] + 0x101].fc.freq =
             s->dyn_ltree[(ulong)""[uVar7 - 3] + 0x101].fc.freq + 1;
        uVar25 = iVar24 - 1;
        uVar9 = (uVar25 >> 7) + 0x100;
        if (uVar25 < 0x100) {
          uVar9 = uVar25;
        }
        s->dyn_dtree[""[uVar9]].fc.freq = s->dyn_dtree[""[uVar9]].fc.freq + 1;
        uVar9 = (uint)(s->sym_next == s->sym_end);
        s->lookahead = s->lookahead - uVar7;
      }
      uVar7 = uVar7 + s->strstart;
      s->strstart = uVar7;
      if (uVar9 != 0) {
        iVar24 = s->block_start;
        if ((long)iVar24 < 0) {
          puVar20 = (uchar *)0x0;
        }
        else {
          puVar20 = s->window + iVar24;
        }
        zng_tr_flush_block(s,(char *)puVar20,uVar7 - iVar24,0);
        s->block_start = s->strstart;
        zng_flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          iVar24 = 1;
          goto LAB_001114aa;
        }
      }
      iVar24 = 0;
    }
LAB_001114aa:
    if (iVar24 != 0) {
      if (iVar24 == 2) {
        uVar9 = s->strstart;
        uVar25 = 2;
        if (uVar9 < 2) {
          uVar25 = uVar9;
        }
        s->insert = uVar25;
        if (flush == 4) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar20 = (uchar *)0x0;
          }
          else {
            puVar20 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar20,uVar9 - iVar2,1);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
          bVar29 = finish_done - (s->strm->avail_out == 0);
        }
        else {
          if (s->sym_next != 0) {
            iVar2 = s->block_start;
            if ((long)iVar2 < 0) {
              puVar20 = (uchar *)0x0;
            }
            else {
              puVar20 = s->window + iVar2;
            }
            zng_tr_flush_block(s,(char *)puVar20,uVar9 - iVar2,0);
            s->block_start = s->strstart;
            zng_flush_pending(s->strm);
            if (s->strm->avail_out == 0) {
              return need_more;
            }
          }
          bVar29 = block_done;
        }
      }
      else {
        bVar29 = need_more;
      }
      return bVar29;
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_medium(deflate_state *s, int flush) {
    /* Align the first struct to start on a new cacheline, this allows us to fit both structs in one cacheline */
    ALIGNED_(16) struct match current_match;
                 struct match next_match;

    /* For levels below 5, don't check the next position for a better match */
    int early_exit = s->level < 5;

    memset(&current_match, 0, sizeof(struct match));
    memset(&next_match, 0, sizeof(struct match));

    for (;;) {
        Pos hash_head = 0;    /* head of the hash chain */
        int bflush = 0;       /* set if current block must be flushed */
        int64_t dist;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next current_match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
            next_match.match_length = 0;
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */

        /* If we already have a future match from a previous round, just use that */
        if (!early_exit && next_match.match_length > 0) {
            current_match = next_match;
            next_match.match_length = 0;
        } else {
            hash_head = 0;
            if (s->lookahead >= WANT_MIN_MATCH) {
                hash_head = quick_insert_string(s, s->strstart);
            }

            current_match.strstart = (uint16_t)s->strstart;
            current_match.orgstart = current_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                current_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                current_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(current_match.match_length < WANT_MIN_MATCH))
                    current_match.match_length = 1;
                if (UNLIKELY(current_match.match_start >= current_match.strstart)) {
                    /* this can happen due to some restarts */
                    current_match.match_length = 1;
                }
            } else {
                /* Set up the match to be a 1 byte literal */
                current_match.match_start = 0;
                current_match.match_length = 1;
            }
        }

        insert_match(s, current_match);

        /* now, look ahead one */
        if (LIKELY(!early_exit && s->lookahead > MIN_LOOKAHEAD && (uint32_t)(current_match.strstart + current_match.match_length) < (s->window_size - MIN_LOOKAHEAD))) {
            s->strstart = current_match.strstart + current_match.match_length;
            hash_head = quick_insert_string(s, s->strstart);

            next_match.strstart = (uint16_t)s->strstart;
            next_match.orgstart = next_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                next_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                next_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(next_match.match_start >= next_match.strstart)) {
                    /* this can happen due to some restarts */
                    next_match.match_length = 1;
                }
                if (next_match.match_length < WANT_MIN_MATCH)
                    next_match.match_length = 1;
                else
                    fizzle_matches(s, &current_match, &next_match);
            } else {
                /* Set up the match to be a 1 byte literal */
                next_match.match_start = 0;
                next_match.match_length = 1;
            }

            s->strstart = current_match.strstart;
        } else {
            next_match.match_length = 0;
        }

        /* now emit the current match */
        bflush = emit_match(s, current_match);

        /* move the "cursor" forward */
        s->strstart += current_match.match_length;

        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);

    return block_done;
}